

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O3

void __thiscall zmq::pipe_t::process_delimiter(pipe_t *this)

{
  anon_enum_32 aVar1;
  anon_enum_32 local_1c;
  
  aVar1 = this->_state;
  if ((this->_state & ~waiting_for_delimiter) != active) {
    process_delimiter();
    aVar1 = local_1c;
  }
  if (aVar1 == active) {
    aVar1 = delimiter_received;
  }
  else {
    rollback(this);
    this->_out_pipe = (upipe_t *)0x0;
    object_t::send_pipe_term_ack(&this->super_object_t,this->_peer);
    aVar1 = term_ack_sent;
  }
  this->_state = aVar1;
  return;
}

Assistant:

void zmq::pipe_t::process_delimiter ()
{
    zmq_assert (_state == active || _state == waiting_for_delimiter);

    if (_state == active)
        _state = delimiter_received;
    else {
        rollback ();
        _out_pipe = NULL;
        send_pipe_term_ack (_peer);
        _state = term_ack_sent;
    }
}